

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

confirm * __thiscall lest::confirm::operator()(confirm *this,test *testing)

{
  _func_void_env_ptr *p_Var1;
  env *peVar2;
  message *e;
  text local_38;
  test *local_18;
  test *testing_local;
  confirm *this_local;
  
  this->selected = this->selected + 1;
  p_Var1 = testing->behaviour;
  local_18 = testing;
  testing_local = (test *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)testing);
  peVar2 = env::operator()(&this->output,&local_38);
  (*p_Var1)(peVar2);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

confirm & operator()( test testing )
    {
        try
        {
            ++selected; testing.behaviour( output( testing.name ) );
        }
        catch( message const & e )
        {
            ++failures; report( os, e, output.context() );
        }
        return *this;
    }